

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this,TypeVector *sig)

{
  LabelType LVar1;
  Result RVar2;
  Result RVar3;
  Label *in_RAX;
  Enum EVar4;
  Label *label;
  
  label = in_RAX;
  RVar2 = TopLabel(this,&label);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    LVar1 = label->label_type;
    RVar2 = PopAndCheckSignature(this,&label->result_types,"try block");
    RVar3 = CheckTypeStackEnd(this,"try block");
    EVar4 = (Enum)((RVar3.enum_ == Error || RVar2.enum_ == Error) || LVar1 + ~Catch < 0xfffffffe);
    ResetTypeStackToLabel(this,label);
    label->label_type = Catch;
    label->unreachable = false;
    PushTypes(this,sig);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnCatch(const TypeVector& sig) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= Check2LabelTypes(label, LabelType::Try, LabelType::Catch);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushTypes(sig);
  return result;
}